

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucal.cpp
# Opt level: O0

int32_t ucal_getTimeZoneIDForWindowsID_63
                  (UChar *winid,int32_t len,char *region,UChar *id,int32_t idCapacity,
                  UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  Char16Ptr local_e0 [3];
  UnicodeString local_c8;
  undefined1 local_88 [8];
  UnicodeString resultID;
  int32_t resultLen;
  UErrorCode *status_local;
  int32_t idCapacity_local;
  UChar *id_local;
  char *region_local;
  int32_t len_local;
  UChar *winid_local;
  
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    resultID.fUnion._52_4_ = 0;
    icu_63::UnicodeString::UnicodeString((UnicodeString *)local_88);
    icu_63::UnicodeString::UnicodeString(&local_c8,winid,len);
    icu_63::TimeZone::getIDForWindowsID(&local_c8,region,(UnicodeString *)local_88,status);
    icu_63::UnicodeString::~UnicodeString(&local_c8);
    UVar1 = U_SUCCESS(*status);
    if (UVar1 != '\0') {
      iVar2 = icu_63::UnicodeString::length((UnicodeString *)local_88);
      if (0 < iVar2) {
        resultID.fUnion._52_4_ = icu_63::UnicodeString::length((UnicodeString *)local_88);
        icu_63::Char16Ptr::Char16Ptr(local_e0,id);
        icu_63::UnicodeString::extract((UnicodeString *)local_88,local_e0,idCapacity,status);
        icu_63::Char16Ptr::~Char16Ptr(local_e0);
      }
    }
    winid_local._4_4_ = resultID.fUnion._52_4_;
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_88);
  }
  else {
    winid_local._4_4_ = 0;
  }
  return winid_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucal_getTimeZoneIDForWindowsID(const UChar* winid, int32_t len, const char* region, UChar* id, int32_t idCapacity, UErrorCode* status) {
    if (U_FAILURE(*status)) {
        return 0;
    }

    int32_t resultLen = 0;
    UnicodeString resultID;

    TimeZone::getIDForWindowsID(UnicodeString(winid, len), region, resultID, *status);
    if (U_SUCCESS(*status) && resultID.length() > 0) {
        resultLen = resultID.length();
        resultID.extract(id, idCapacity, *status);
    }

    return resultLen;
}